

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O0

ssize_t __thiscall
wasm::LEB<unsigned_int,_unsigned_char>::read
          (LEB<unsigned_int,_unsigned_char> *this,int __fd,void *__buf,size_t __nbytes)

{
  ParseException *pPVar1;
  undefined4 in_register_00000034;
  uint local_ac;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6d;
  allocator<char> local_59;
  string local_58;
  uint local_34;
  uint local_30;
  uint unused_bits;
  uint unused_bits_mask;
  uint significant_payload;
  uint payload_mask;
  uint payload;
  bool last;
  uchar byte;
  function<unsigned_char_()> *pfStack_18;
  uint shift;
  function<unsigned_char_()> *get_local;
  LEB<unsigned_int,_unsigned_char> *this_local;
  
  this->value = 0;
  payload = 0;
  pfStack_18 = (function<unsigned_char_()> *)CONCAT44(in_register_00000034,__fd);
  get_local = (function<unsigned_char_()> *)this;
  while( true ) {
    payload_mask._3_1_ =
         std::function<unsigned_char_()>::operator()
                   ((function<unsigned_char_()> *)CONCAT44(in_register_00000034,__fd));
    payload_mask._2_1_ = ((payload_mask._3_1_ & 0x80) != 0 ^ 0xffU) & 1;
    significant_payload = payload_mask._3_1_ & 0x7f;
    if (payload == 0) {
      local_ac = 0xffffffff;
    }
    else {
      local_ac = (1 << (0x20 - (byte)payload & 0x1f)) - 1;
    }
    unused_bits_mask = local_ac;
    unused_bits = local_ac & significant_payload;
    this->value = unused_bits << ((byte)payload & 0x1f) | this->value;
    local_30 = (local_ac ^ 0xffffffff) & 0x7f;
    local_34 = significant_payload & local_30;
    if (local_34 != 0) {
      local_6d = 1;
      pPVar1 = (ParseException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Unused non-negative LEB bits must be 0s",&local_59);
      ParseException::ParseException(pPVar1,&local_58);
      local_6d = 0;
      __cxa_throw(pPVar1,&ParseException::typeinfo,ParseException::~ParseException);
    }
    if (payload_mask._2_1_ != 0) {
      return (ssize_t)this;
    }
    payload = payload + 7;
    if (0x1f < payload) break;
    local_34 = 0;
    payload_mask._2_1_ = 0;
  }
  pPVar1 = (ParseException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"LEB overflow",&local_91);
  ParseException::ParseException(pPVar1,&local_90);
  __cxa_throw(pPVar1,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

LEB<T, MiniT>& read(std::function<MiniT()> get) {
    value = 0;
    T shift = 0;
    MiniT byte;
    while (1) {
      byte = get();
      bool last = !(byte & 128);
      T payload = byte & 127;
      using mask_type = typename std::make_unsigned<T>::type;
      auto payload_mask = 0 == shift
                            ? ~mask_type(0)
                            : ((mask_type(1) << (sizeof(T) * 8 - shift)) - 1u);
      T significant_payload = payload_mask & payload;
      value |= significant_payload << shift;
      T unused_bits_mask = ~payload_mask & 127;
      T unused_bits = payload & unused_bits_mask;
      if (std::is_signed_v<T> && value < 0) {
        if (unused_bits != unused_bits_mask) {
          throw ParseException("Unused negative LEB bits must be 1s");
        }
      } else {
        if (unused_bits != 0) {
          throw ParseException("Unused non-negative LEB bits must be 0s");
        }
      }
      if (last) {
        break;
      }
      shift += 7;
      if (size_t(shift) >= sizeof(T) * 8) {
        throw ParseException("LEB overflow");
      }
    }
    // If signed LEB, then we might need to sign-extend.
    if constexpr (std::is_signed_v<T>) {
      shift += 7;
      if ((byte & 64) && size_t(shift) < 8 * sizeof(T)) {
        size_t sext_bits = 8 * sizeof(T) - size_t(shift);
        value <<= sext_bits;
        value >>= sext_bits;
        if (value >= 0) {
          throw ParseException(
            " LEBsign-extend should produce a negative value");
        }
      }
    }
    return *this;
  }